

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall Graph<Node>::connectedComponents(Graph<Node> *this)

{
  vector<int> *pvVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  bool *__s;
  int iVar7;
  size_t extraout_RDX;
  size_t __size;
  size_t extraout_RDX_00;
  size_t __size_00;
  size_t extraout_RDX_01;
  long lVar8;
  void *__ptr;
  vector<int> *pvVar9;
  long lVar10;
  vector<int> currComp;
  vector<bool> used;
  int local_54;
  vector<int> local_50;
  vector<bool> local_40;
  
  local_40._size = this->_nodeCnt;
  iVar5 = 1;
  do {
    iVar7 = iVar5;
    iVar5 = iVar7 * 2;
  } while (iVar7 < local_40._size);
  iVar5 = -1;
  if (-1 < iVar7) {
    iVar5 = iVar7;
  }
  __s = (bool *)operator_new__((long)iVar5);
  memset(__s,0,(long)iVar5);
  local_40.vect = __s;
  local_40._capacity = iVar7;
  local_50.vect = (int *)operator_new__(4);
  *local_50.vect = 0;
  local_50._size = 0;
  local_50._capacity = 1;
  local_54 = 0;
  iVar5 = this->_nodeCnt;
  __size = extraout_RDX;
  if (0 < iVar5) {
    do {
      if (local_40.vect[local_54] == false) {
        while (local_50._size != 0) {
          local_50._size = local_50._size + -1;
          if (local_50._size <= local_50._capacity / 2) {
            vector<int>::realloc(&local_50,(void *)(ulong)(uint)(local_50._capacity / 2),__size);
            __size = extraout_RDX_00;
          }
        }
        currCC(this,&local_50,&local_40,&local_54);
        iVar5 = (this->compList)._capacity;
        if (iVar5 <= (this->compList)._size) {
          vector<vector<int>_>::realloc(&this->compList,(void *)(ulong)(uint)(iVar5 * 2),__size_00);
        }
        iVar5 = (this->compList)._size;
        (this->compList)._size = iVar5 + 1;
        vector<int>::operator=((this->compList).vect + iVar5,&local_50);
        __size = extraout_RDX_01;
      }
      local_54 = local_54 + 1;
      iVar5 = this->_nodeCnt;
    } while (local_54 < iVar5);
  }
  uVar6 = 1;
  do {
    __ptr = (void *)(ulong)uVar6;
    bVar4 = (int)uVar6 < iVar5;
    uVar6 = uVar6 * 2;
  } while (bVar4);
  vector<int>::realloc(&this->inCC,__ptr,__size);
  (this->inCC)._size = iVar5;
  if (0 < (this->compList)._size) {
    pvVar1 = (this->compList).vect;
    piVar2 = (this->inCC).vect;
    lVar8 = 0;
    do {
      if (0 < pvVar1[lVar8]._size) {
        pvVar9 = pvVar1 + lVar8;
        piVar3 = pvVar9->vect;
        lVar10 = 0;
        do {
          piVar2[piVar3[lVar10]] = (int)lVar8;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pvVar9->_size);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->compList)._size);
  }
  if (local_50.vect != (int *)0x0) {
    operator_delete__(local_50.vect);
  }
  if (local_40.vect != (bool *)0x0) {
    operator_delete__(local_40.vect);
  }
  return;
}

Assistant:

void connectedComponents() {
        vector <bool> used(_nodeCnt);
        vector <int> currComp;

        for (int i = 0; i < _nodeCnt; ++i) {
            if (!used[i]) {
                currComp.clear();
                currCC(currComp, used, i);
                compList.push_back(currComp);
            }
        }

        inCC.resize(_nodeCnt);
        for (int i = 0; i < compList.size(); ++i) {
            for (int j = 0; j < compList[i].size(); ++j) {
                int currNode = compList[i][j];
                inCC[currNode] = i;
            }
        }
    }